

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O2

string * __thiscall
cmGlobalNinjaGenerator::EncodePath
          (string *__return_storage_ptr__,cmGlobalNinjaGenerator *this,string *path)

{
  string result;
  string local_30;
  
  std::__cxx11::string::string((string *)&local_30,(string *)path);
  EncodeLiteral(__return_storage_ptr__,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

std::string cmGlobalNinjaGenerator::EncodePath(const std::string& path)
{
  std::string result = path; // NOLINT(clang-tidy)
#ifdef _WIN32
  if (this->IsGCCOnWindows())
    std::replace(result.begin(), result.end(), '\\', '/');
  else
    std::replace(result.begin(), result.end(), '/', '\\');
#endif
  return EncodeLiteral(result);
}